

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void * parse_variable(Parser *parser,Modifier *modifier)

{
  Kind KVar1;
  Token *name;
  Type *type;
  VarTerm *pVVar2;
  void *expr;
  uint uVar3;
  bool bVar4;
  
  name = parser->token;
  expect(parser,ID);
  while (KVar1 = parser->token->kind, KVar1 == NEWLINE) {
    move(parser);
  }
  if (KVar1 == EQ) {
    bVar4 = true;
LAB_0010493c:
    type = (Type *)0x0;
  }
  else {
    if (KVar1 != COLON) {
      bVar4 = false;
      log_debug(
               "/workspace/llm4binary/github/license_all_cmakelists_25/editso[P]timely-lang/parser.c:182"
               );
      log_code(parser->lexer->source,parser->token->row_pos,parser->token->col_pos,
               "Variable type is ambiguous","");
      goto LAB_0010493c;
    }
    bmove(parser);
    KVar1 = parser->token->kind;
    if ((KVar1 - STATIC < 5) || (KVar1 == BOOL)) {
      bmove(parser);
    }
    else {
      expect(parser,ID);
    }
    type = new_type(parser->token);
    bVar4 = parser->token->kind == EQ;
  }
  pVVar2 = new_var_term(name,(void *)0x0,type,modifier);
  uVar3 = parser->token->kind - LE_EQ;
  if ((uVar3 < 0x18) && ((0xf0fc13U >> (uVar3 & 0x1f) & 1) != 0)) {
    if (!bVar4) goto LAB_00104976;
  }
  else if (!bVar4) {
    return pVVar2;
  }
  bmove(parser);
LAB_00104976:
  expr = parse_logic(parser);
  pVVar2 = new_var_term(name,expr,type,modifier);
  return pVVar2;
}

Assistant:

void *parse_variable(Parser *parser, Modifier *modifier) {
    Token *tok = token(parser);
    expect(parser, ID);
    break_newline(parser);
    Kind kid = token(parser)->kind;
    Type *var_type = NULL;
    if (kid == COLON) {
        bmove(parser);
        if (is_basic_type(token(parser))) {
            bmove(parser);
        } else {
            expect(parser, ID);
        }
        var_type = new_type(token(parser));
        kid = token(parser)->kind;
    } else if (kid != EQ) {
        break_newline(parser);
        parse_error(parser, "Variable type is ambiguous", "");
    }
    void *term = new_var_term(tok, NULL, var_type, modifier);
    if (is_operator(token(parser)) || kid == EQ) {
        if (kid == EQ) {
            bmove(parser);
        }
        term = new_var_term(tok, parse_expr(parser), var_type, modifier);
    }
    return term;
}